

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_singletons.c
# Opt level: O0

lu_int __thiscall lu_singletons(lu *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  double abstol_00;
  int m_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  lu_int *pinv_00;
  lu_int *qinv_00;
  lu_int *Lp;
  lu_int *Up;
  double *col_pivot_00;
  lu_int *Li;
  double *Lx;
  lu_int *Ui;
  double *Ux;
  lu_int *iset;
  lu_int *Btp_00;
  lu_int *Bti_00;
  double *Btx_00;
  bool bVar5;
  bool bVar6;
  lu_int lVar7;
  lu_int *queue;
  lu_int *in_RCX;
  lu_int *in_RDX;
  lu_int *in_RSI;
  int *in_RDI;
  double *in_R8;
  lu_int ok;
  lu_int Bnz;
  lu_int rank;
  lu_int put;
  lu_int pos;
  lu_int j;
  lu_int i;
  double *Btx;
  lu_int *Bti;
  lu_int *Btp;
  lu_int *iwork2;
  lu_int *iwork1;
  double *Uvalue;
  lu_int *Uindex;
  double *Lvalue;
  lu_int *Lindex;
  double *col_pivot;
  lu_int *Ubegin;
  lu_int *Lbegin_p;
  lu_int *qinv;
  lu_int *pinv;
  lu_int nzbias;
  double abstol;
  lu_int Wmem;
  lu_int Umem;
  lu_int Lmem;
  lu_int m;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  lu_int local_34;
  
  m_00 = in_RDI[0x15];
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[2];
  abstol_00 = *(double *)(in_RDI + 6);
  iVar4 = in_RDI[10];
  pinv_00 = *(lu_int **)(in_RDI + 0x96);
  qinv_00 = *(lu_int **)(in_RDI + 0x9a);
  Lp = *(lu_int **)(in_RDI + 0x9e);
  Up = *(lu_int **)(in_RDI + 0xa0);
  col_pivot_00 = *(double **)(in_RDI + 0xaa);
  Li = *(lu_int **)(in_RDI + 0x68);
  Lx = *(double **)(in_RDI + 0x6e);
  Ui = *(lu_int **)(in_RDI + 0x6a);
  Ux = *(double **)(in_RDI + 0x70);
  iset = *(lu_int **)(in_RDI + 0x84);
  queue = iset + m_00;
  Btp_00 = *(lu_int **)(in_RDI + 0x86);
  Bti_00 = *(lu_int **)(in_RDI + 0x6c);
  Btx_00 = *(double **)(in_RDI + 0x72);
  local_108 = 0;
  bVar6 = true;
  local_f8 = 0;
  while( true ) {
    bVar5 = false;
    if (local_f8 < m_00) {
      bVar5 = bVar6;
    }
    if (!bVar5) break;
    if (in_RDX[local_f8] < in_RSI[local_f8]) {
      bVar6 = false;
    }
    else {
      local_108 = (in_RDX[local_f8] - in_RSI[local_f8]) + local_108;
    }
    local_f8 = local_f8 + 1;
  }
  if (bVar6) {
    if (iVar1 < local_108) {
      in_RDI[0x16] = local_108 - iVar1;
    }
    if (iVar2 < local_108) {
      in_RDI[0x17] = local_108 - iVar2;
    }
    if (iVar3 < local_108) {
      in_RDI[0x18] = local_108 - iVar3;
    }
    if (iVar3 < local_108 || (iVar2 < local_108 || iVar1 < local_108)) {
      local_34 = 1;
    }
    else {
      memset(iset,0,(long)m_00 << 2);
      bVar6 = true;
      local_f8 = 0;
      while( true ) {
        bVar5 = false;
        if (local_f8 < m_00) {
          bVar5 = bVar6;
        }
        if (!bVar5) break;
        local_fc = in_RSI[local_f8];
        while( true ) {
          bVar5 = false;
          if (local_fc < in_RDX[local_f8]) {
            bVar5 = bVar6;
          }
          if (!bVar5) break;
          iVar1 = in_RCX[local_fc];
          if ((iVar1 < 0) || (m_00 <= iVar1)) {
            bVar6 = false;
          }
          else {
            iset[iVar1] = iset[iVar1] + 1;
          }
          local_fc = local_fc + 1;
        }
        local_f8 = local_f8 + 1;
      }
      if (bVar6) {
        local_100 = 0;
        for (local_f4 = 0; local_f4 < m_00; local_f4 = local_f4 + 1) {
          Btp_00[local_f4] = local_100;
          local_100 = iset[local_f4] + local_100;
          iset[local_f4] = Btp_00[local_f4];
        }
        Btp_00[m_00] = local_100;
        bVar6 = true;
        for (local_f8 = 0; local_f8 < m_00; local_f8 = local_f8 + 1) {
          for (local_fc = in_RSI[local_f8]; local_fc < in_RDX[local_f8]; local_fc = local_fc + 1) {
            iVar1 = in_RCX[local_fc];
            iVar2 = iset[iVar1];
            iset[iVar1] = iVar2 + 1;
            Bti_00[iVar2] = local_f8;
            Btx_00[iVar2] = in_R8[local_fc];
            if ((Btp_00[iVar1] < iVar2) && (Bti_00[iVar2 + -1] == local_f8)) {
              bVar6 = false;
            }
          }
        }
        if (bVar6) {
          for (local_f4 = 0; local_f4 < m_00; local_f4 = local_f4 + 1) {
            pinv_00[local_f4] = -1;
          }
          for (local_f8 = 0; local_f8 < m_00; local_f8 = local_f8 + 1) {
            qinv_00[local_f8] = -1;
          }
          if (iVar4 < 0) {
            *Up = 0;
            *Lp = 0;
            lVar7 = singleton_rows(m_00,in_RSI,in_RDX,in_RCX,in_R8,Btp_00,Bti_00,Btx_00,Up,Ui,Ux,Lp,
                                   Li,Lx,col_pivot_00,pinv_00,qinv_00,iset,queue,0,abstol_00);
            local_104 = singleton_cols(m_00,in_RSI,in_RDX,in_RCX,in_R8,Btp_00,Bti_00,Btx_00,Up,Ui,Ux
                                       ,Lp,Li,Lx,col_pivot_00,pinv_00,qinv_00,iset,queue,lVar7,
                                       abstol_00);
          }
          else {
            *Up = 0;
            *Lp = 0;
            lVar7 = singleton_cols(m_00,in_RSI,in_RDX,in_RCX,in_R8,Btp_00,Bti_00,Btx_00,Up,Ui,Ux,Lp,
                                   Li,Lx,col_pivot_00,pinv_00,qinv_00,iset,queue,0,abstol_00);
            local_104 = singleton_rows(m_00,in_RSI,in_RDX,in_RCX,in_R8,Btp_00,Bti_00,Btx_00,Up,Ui,Ux
                                       ,Lp,Li,Lx,col_pivot_00,pinv_00,qinv_00,iset,queue,lVar7,
                                       abstol_00);
          }
          for (local_f4 = 0; local_f4 < m_00; local_f4 = local_f4 + 1) {
            if (pinv_00[local_f4] < 0) {
              pinv_00[local_f4] = -1;
            }
          }
          for (local_f8 = 0; local_f8 < m_00; local_f8 = local_f8 + 1) {
            if (qinv_00[local_f8] < 0) {
              qinv_00[local_f8] = -1;
            }
          }
          in_RDI[0x4e] = local_108;
          in_RDI[0x4f] = local_104;
          local_34 = 0;
        }
        else {
          local_34 = -4;
        }
      }
      else {
        local_34 = -4;
      }
    }
  }
  else {
    local_34 = -4;
  }
  return local_34;
}

Assistant:

lu_int lu_singletons(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m      = this->m;
    const lu_int Lmem   = this->Lmem;
    const lu_int Umem   = this->Umem;
    const lu_int Wmem   = this->Wmem;
    const double abstol = this->abstol;
    const lu_int nzbias = this->nzbias;
    lu_int *pinv        = this->pinv;
    lu_int *qinv        = this->qinv;
    lu_int *Lbegin_p    = this->Lbegin_p;
    lu_int *Ubegin      = this->Ubegin;
    double *col_pivot   = this->col_pivot;
    lu_int *Lindex      = this->Lindex;
    double *Lvalue      = this->Lvalue;
    lu_int *Uindex      = this->Uindex;
    double *Uvalue      = this->Uvalue;
    lu_int *iwork1      = this->iwork1;
    lu_int *iwork2      = iwork1 + m;

    lu_int *Btp         = this->Wbegin; /* build B rowwise in W */
    lu_int *Bti         = this->Windex;
    double *Btx         = this->Wvalue;

    lu_int i, j, pos, put, rank, Bnz, ok;

    /* -------------------------------- */
    /* Check matrix and build transpose */
    /* -------------------------------- */

    /* Check pointers and count nnz(B). */
    Bnz = 0;
    ok = 1;
    for (j = 0; j < m && ok; j++)
    {
        if (Bend[j] < Bbegin[j])
            ok = 0;
        else
            Bnz += Bend[j] - Bbegin[j];
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* Check if sufficient memory in L, U, W. */
    ok = 1;
    if (Lmem < Bnz) { this->addmemL = Bnz-Lmem; ok = 0; }
    if (Umem < Bnz) { this->addmemU = Bnz-Umem; ok = 0; }
    if (Wmem < Bnz) { this->addmemW = Bnz-Wmem; ok = 0; }
    if (!ok)
        return BASICLU_REALLOCATE;

    /* Count nz per row, check indices. */
    memset(iwork1, 0, m*sizeof(lu_int)); /* row counts */
    ok = 1;
    for (j = 0; j < m && ok; j++)
    {
        for (pos = Bbegin[j]; pos < Bend[j] && ok; pos++)
        {
            i = Bi[pos];
            if (i < 0 || i >= m)
                ok = 0;
            else
                iwork1[i]++;
        }
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* Pack matrix rowwise, check for duplicates. */
    put = 0;
    for (i = 0; i < m; i++)     /* set row pointers */
    {
        Btp[i] = put;
        put += iwork1[i];
        iwork1[i] = Btp[i];
    }
    Btp[m] = put;
    assert(put == Bnz);
    ok = 1;
    for (j = 0; j < m; j++)     /* fill rows */
    {
        for (pos = Bbegin[j]; pos < Bend[j]; pos++)
        {
            i = Bi[pos];
            put = iwork1[i]++;
            Bti[put] = j;
            Btx[put] = Bx [pos];
            if (put > Btp[i] && Bti[put-1] == j)
                ok = 0;
        }
    }
    if (!ok)
        return BASICLU_ERROR_invalid_argument;

    /* ---------------- */
    /* Pivot singletons */
    /* ---------------- */

    /* No pivot rows or pivot columns so far. */
    for (i = 0; i < m; i++)
        pinv[i] = -1;
    for (j = 0; j < m; j++)
        qinv[j] = -1;

    if (nzbias >= 0)            /* put more in U */
    {
        Lbegin_p[0] = Ubegin[0] = rank = 0;

        rank = singleton_cols(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);

        rank = singleton_rows(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);
    }
    else                        /* put more in L */
    {
        Lbegin_p[0] = Ubegin[0] = rank = 0;

        rank = singleton_rows(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);

        rank = singleton_cols(m, Bbegin, Bend, Bi, Bx, Btp, Bti, Btx,
                              Ubegin, Uindex, Uvalue, Lbegin_p, Lindex, Lvalue,
                              col_pivot, pinv, qinv, iwork1, iwork2, rank,
                              abstol);
    }

    /* pinv, qinv were used as nonzero counters. Reset to -1 if not pivoted. */
    for (i = 0; i < m; i++)
        if (pinv[i] < 0)
            pinv[i] = -1;
    for (j = 0; j < m; j++)
        if (qinv[j] < 0)
            qinv[j] = -1;

    this->matrix_nz = Bnz;
    this->rank = rank;
    return BASICLU_OK;
}